

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O2

void __thiscall
test_adjacency_graph_resize_undirected_Test::~test_adjacency_graph_resize_undirected_Test
          (test_adjacency_graph_resize_undirected_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_adjacency_graph, resize_undirected) {

  // Test sizing up.
  Adjacency_Graph<false> graph;
  graph.resize(5);
  EXPECT_EQ(graph.size_edge(), 0);
  EXPECT_EQ(graph.size_vertex(), 5);

  // Test size down, start with a fully connected pentagon graph.
  graph = Adjacency_Graph<false>({{0, 1}, {1, 2}, {2, 3}, {3, 4}, {0, 4}, {0, 2}, {0, 3}, {1, 3}, {1, 4}, {2, 4}});

  graph.resize(3);  // get rid of all two vertices - it's now a 2-simplex.
  EXPECT_EQ(graph.size_edge(), 3);
  EXPECT_EQ(graph.size_vertex(), 3);
  EXPECT_EQ(graph[0].size(), 2);
  EXPECT_EQ(graph[0][0], 1);
  EXPECT_EQ(graph[0][1], 2);
  EXPECT_EQ(graph[1].size(), 2);
  EXPECT_EQ(graph[1][0], 0);
  EXPECT_EQ(graph[1][1], 2);
  EXPECT_EQ(graph[2].size(), 2);
  EXPECT_EQ(graph[2][0], 0);
  EXPECT_EQ(graph[2][1], 1);

  // check zero sizing.
  graph.resize(0);
  EXPECT_EQ(graph.size_edge(), 0);
  EXPECT_EQ(graph.size_vertex(), 0);
}